

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O2

bool DecodeBase58(string *str,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchRet,
                 int max_ret_len)

{
  long lVar1;
  bool bVar2;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  string_view str_00;
  
  str_00._M_str._4_4_ = in_register_00000014;
  str_00._M_str._0_4_ = max_ret_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_00._M_len = (size_t)(str->_M_dataplus)._M_p;
  bVar2 = util::ContainsNoNUL((util *)str->_M_string_length,str_00);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      bVar2 = DecodeBase58((str->_M_dataplus)._M_p,vchRet,max_ret_len);
      return bVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeBase58(const std::string& str, std::vector<unsigned char>& vchRet, int max_ret_len)
{
    if (!ContainsNoNUL(str)) {
        return false;
    }
    return DecodeBase58(str.c_str(), vchRet, max_ret_len);
}